

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateJSONObjectKeyNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)

{
  sxu32 local_2c;
  sxi32 local_1c;
  sxi32 rc;
  jx9_expr_node *pRoot_local;
  jx9_gen_state *pGen_local;
  
  local_1c = 0;
  if ((((pRoot->xCode != jx9CompileVariable) && (pRoot->xCode != jx9CompileString)) &&
      (pRoot->xCode != jx9CompileSimpleString)) && (pRoot->xCode != jx9CompileLiteral)) {
    if (pRoot->pStart == (SyToken *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = pRoot->pStart->nLine;
    }
    local_1c = jx9GenCompileError(pGen,1,local_2c,
                                  "JSON Object: Unexpected expression, key must be of type string, literal or simple variable"
                                 );
    if (local_1c != -10) {
      local_1c = -9;
    }
  }
  return local_1c;
}

Assistant:

static sxi32 GenStateJSONObjectKeyNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)
{
	sxi32 rc = SXRET_OK;
	if( pRoot->xCode != jx9CompileVariable && pRoot->xCode != jx9CompileString 
		&& pRoot->xCode != jx9CompileSimpleString && pRoot->xCode != jx9CompileLiteral ){
		/* Unexpected expression */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pRoot->pStart? pRoot->pStart->nLine : 0, 
			"JSON Object: Unexpected expression, key must be of type string, literal or simple variable");
		if( rc != SXERR_ABORT ){
			rc = SXERR_INVALID;
		}
	}
	return rc;
}